

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * gl4cts::anon_unknown_0::GetInput140c1
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  reference pvVar1;
  float *fp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x20);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\0';
  pvVar1[1] = '\0';
  pvVar1[2] = 0x80;
  pvVar1[3] = '?';
  pvVar1[4] = '\0';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\0';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\0';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar1[0x10] = '\0';
  pvVar1[0x11] = '\0';
  pvVar1[0x12] = '\0';
  pvVar1[0x13] = '@';
  return 
  "\nlayout(std140, binding = 0) buffer Input {\n  float data0[2];\n} g_input;\nlayout(std140, binding = 1) buffer Output {\n  float data0[2];\n} g_output;\nvoid main() {\n  for (int i = 0; i < g_input.data0.length(); ++i) g_output.data0[i] = g_input.data0[i];\n}"
  ;
}

Assistant:

const char* GetInput140c1(std::vector<GLubyte>& in_data)
{
	in_data.resize(8 * 4);
	float* fp = reinterpret_cast<float*>(&in_data[0]);
	fp[0]	 = 1.0f;
	fp[1]	 = 0.0f;
	fp[2]	 = 0.0f;
	fp[3]	 = 0.0f;
	fp[4]	 = 2.0f;

	return NL "layout(std140, binding = 0) buffer Input {" NL "  float data0[2];" NL "} g_input;" NL
			  "layout(std140, binding = 1) buffer Output {" NL "  float data0[2];" NL "} g_output;" NL
			  "void main() {" NL
			  "  for (int i = 0; i < g_input.data0.length(); ++i) g_output.data0[i] = g_input.data0[i];" NL "}";
}